

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O0

int mbedtls_asn1_write_len(uchar **p,uchar *start,size_t len)

{
  uchar *puVar1;
  size_t l;
  int required;
  size_t len_local;
  uchar *start_local;
  uchar **p_local;
  int local_4;
  
  if (len < 0x100000000) {
    required = 1;
    l = len;
    if (0x7f < len) {
      for (; l != 0; l = l >> 8) {
        required = required + 1;
      }
    }
    len_local = len;
    if ((long)*p - (long)start < (long)required) {
      local_4 = -0x6c;
    }
    else {
      do {
        puVar1 = *p;
        *p = puVar1 + -1;
        puVar1[-1] = (uchar)len_local;
        len_local = len_local >> 8;
      } while (len_local != 0);
      if (1 < required) {
        puVar1 = *p;
        *p = puVar1 + -1;
        puVar1[-1] = (char)required + '\x7f';
      }
      local_4 = required;
    }
  }
  else {
    local_4 = -100;
  }
  return local_4;
}

Assistant:

int mbedtls_asn1_write_len(unsigned char **p, const unsigned char *start, size_t len)
{
#if SIZE_MAX > 0xFFFFFFFF
    if (len > 0xFFFFFFFF) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }
#endif

    int required = 1;

    if (len >= 0x80) {
        for (size_t l = len; l != 0; l >>= 8) {
            required++;
        }
    }

    if (required > (*p - start)) {
        return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
    }

    do {
        *--(*p) = MBEDTLS_BYTE_0(len);
        len >>= 8;
    } while (len);

    if (required > 1) {
        *--(*p) = (unsigned char) (0x80 + required - 1);
    }

    return required;
}